

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileString(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  sxi32 sVar1;
  sxi32 rc;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  sVar1 = GenStateCompileString(pGen);
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileString(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	sxi32 rc;
	rc = GenStateCompileString(&(*pGen));
	SXUNUSED(iCompileFlag); /* cc warning */
	/* Compilation result */
	return rc;
}